

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::cpp::ClassDataType_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,Descriptor *descriptor,Options *options)

{
  bool bVar1;
  allocator<char> local_31;
  unsigned_long local_30;
  FormatSpec<unsigned_long> local_28;
  
  bVar1 = HasDescriptorMethods(*(FileDescriptor **)(this + 0x18),(Options *)descriptor);
  if ((!bVar1) &&
     (bVar1 = IsBootstrapProto((Options *)descriptor,*(FileDescriptor **)(this + 0x18)), !bVar1)) {
    local_28.super_type.spec_.data_ = "ClassDataLite<%d>";
    local_28.super_type.spec_.size_ = 0x11;
    local_30 = (ulong)*(ushort *)(*(long *)(this + 0x10) + 2) + 1;
    absl::lts_20250127::StrFormat<unsigned_long>(__return_storage_ptr__,&local_28,&local_30);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"ClassDataFull",&local_31);
  return __return_storage_ptr__;
}

Assistant:

std::string ClassDataType(const Descriptor* descriptor,
                          const Options& options) {
  return HasDescriptorMethods(descriptor->file(), options) ||
                 // Boostrap protos are always full, even when lite is forced
                 // via options.
                 IsBootstrapProto(options, descriptor->file())
             ? "ClassDataFull"
             : absl::StrFormat("ClassDataLite<%d>",
                               descriptor->full_name().size() + 1);
}